

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O0

void __thiscall
Finger::getPoints(Finger *this,vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt,
                 Vec4i *v)

{
  int *piVar1;
  reference pvVar2;
  Point_<int> local_44;
  int local_3c;
  int faridx;
  int local_30;
  int endidx;
  int local_24;
  Vec4i *pVStack_20;
  int startidx;
  Vec4i *v_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt_local;
  Finger *this_local;
  
  pVStack_20 = v;
  v_local = (Vec4i *)cnt;
  cnt_local = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this;
  piVar1 = cv::Vec<int,_4>::operator[](v,0);
  local_24 = *piVar1;
  pvVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                     (cnt,(long)local_24);
  cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffffd4,pvVar2);
  cv::Point_<int>::operator=(&this->ptStart,(Point_<int> *)&stack0xffffffffffffffd4);
  piVar1 = cv::Vec<int,_4>::operator[](v,1);
  local_30 = *piVar1;
  pvVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                     (cnt,(long)local_30);
  cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffffc8,pvVar2);
  cv::Point_<int>::operator=(&this->ptEnd,(Point_<int> *)&stack0xffffffffffffffc8);
  piVar1 = cv::Vec<int,_4>::operator[](v,2);
  local_3c = *piVar1;
  pvVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                     (cnt,(long)local_3c);
  cv::Point_<int>::Point_(&local_44,pvVar2);
  cv::Point_<int>::operator=(&this->ptFar,&local_44);
  return;
}

Assistant:

void Finger::getPoints(vector<Point> cnt, Vec4i v) {
    int startidx = v[0];
    ptStart = Point(cnt[startidx]);
    int endidx = v[1];
    ptEnd = Point(cnt[endidx]);
    int faridx = v[2];
    ptFar = Point(cnt[faridx]);
}